

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

void ppack(FILE *fdes,ck_msg_type type,CheckMsg *msg)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  int line;
  char *fmt;
  ulong __n;
  char *buf;
  
  buf = (char *)0x0;
  uVar1 = pack(type,&buf,msg);
  if ((int)uVar1 < 0) {
    fmt = "pack failed";
  }
  else {
    __n = (ulong)uVar1;
    sVar2 = get_max_msg_size();
    if (__n <= sVar2) {
      sVar3 = fwrite(buf,1,__n,(FILE *)fdes);
      fflush((FILE *)fdes);
      if (sVar3 == __n) {
        free(buf);
        return;
      }
      fmt = "Error in call to fwrite:";
      line = 0x176;
      goto LAB_0010518f;
    }
    fmt = "Message string too long";
  }
  line = 0x16d;
LAB_0010518f:
  eprintf(fmt,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,line);
}

Assistant:

void ppack(FILE * fdes, enum ck_msg_type type, CheckMsg * msg)
{
    char *buf = NULL;
    int n;
    size_t r;

    n = pack(type, &buf, msg);
    if(n < 0)
        eprintf("pack failed", __FILE__, __LINE__ - 2);
    /* Keep it on the safe side to not send too much data. */
    if((size_t) n > get_max_msg_size())
        eprintf("Message string too long", __FILE__, __LINE__ - 5);

    pthread_cleanup_push(ppack_cleanup, &ck_mutex_lock);
    pthread_mutex_lock(&ck_mutex_lock);
    r = fwrite(buf, 1, (size_t) n, fdes);
    fflush(fdes);
    pthread_mutex_unlock(&ck_mutex_lock);
    pthread_cleanup_pop(0);
    if(r != (size_t) n)
        eprintf("Error in call to fwrite:", __FILE__, __LINE__ - 5);

    free(buf);
}